

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::clearBufferfv
          (ReferenceContext *this,deUint32 buffer,int drawbuffer,float *value)

{
  int iVar1;
  bool bVar2;
  ConstPixelBufferAccess *pCVar3;
  ConstPixelBufferAccess *pCVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  ConstPixelBufferAccess *pCVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  MultisamplePixelBufferAccess access;
  MultisamplePixelBufferAccess colorBuf;
  byte local_bd;
  int local_bc;
  MultisampleConstPixelBufferAccess local_b0;
  TextureFormat local_88;
  int aiStack_80 [2];
  undefined1 local_78 [72];
  
  if (buffer - 0x1802 < 0xfffffffe) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x500;
    return;
  }
  if (drawbuffer != 0) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x501;
    return;
  }
  if (this->m_scissorEnabled == true) {
    iVar11 = (this->m_scissorBox).m_data[0];
    local_bc = (this->m_scissorBox).m_data[1];
    iVar7 = (this->m_scissorBox).m_data[2];
    iVar12 = (this->m_scissorBox).m_data[3];
  }
  else {
    local_bc = 0;
    iVar12 = 0x7fffffff;
    iVar7 = 0x7fffffff;
    iVar11 = 0;
  }
  if (buffer != 0x1800) {
    getDrawDepthbuffer((MultisamplePixelBufferAccess *)(local_78 + 0x10),this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&local_b0,(MultisamplePixelBufferAccess *)(local_78 + 0x10));
    iVar5 = 0;
    if (0 < iVar11) {
      iVar5 = iVar11;
    }
    iVar8 = 0;
    if (0 < local_bc) {
      iVar8 = local_bc;
    }
    iVar1 = iVar7 + iVar11;
    if (local_b0.m_access.m_size.m_data[1] <= iVar7 + iVar11) {
      iVar1 = local_b0.m_access.m_size.m_data[1];
    }
    iVar11 = iVar12 + local_bc;
    if (local_b0.m_access.m_size.m_data[2] <= iVar12 + local_bc) {
      iVar11 = local_b0.m_access.m_size.m_data[2];
    }
    iVar11 = iVar11 - iVar8;
    iVar7 = 0;
    if (0 < iVar11) {
      iVar7 = iVar11;
    }
    if (iVar1 - iVar5 < 1) {
      return;
    }
    if (iVar11 < 1) {
      return;
    }
    if (this->m_depthMask != true) {
      return;
    }
    rr::getSubregion((MultisamplePixelBufferAccess *)&local_b0,
                     (MultisamplePixelBufferAccess *)(local_78 + 0x10),iVar5,iVar8,iVar1 - iVar5,
                     iVar7);
    rr::clearDepth((MultisamplePixelBufferAccess *)&local_b0,*value);
    return;
  }
  getDrawColorbuffer((MultisamplePixelBufferAccess *)(local_78 + 0x10),this);
  bVar2 = (this->m_colorMask).m_data[1];
  if ((this->m_colorMask).m_data[0] == true) {
    if ((bVar2 == false) || ((this->m_colorMask).m_data[2] != true)) goto LAB_018ac874;
    local_bd = (this->m_colorMask).m_data[3] ^ 1;
  }
  else {
    if ((bVar2 == false) && ((this->m_colorMask).m_data[2] == false)) {
      local_bd = 1;
      bVar10 = (this->m_colorMask).m_data[3] ^ 1;
      goto LAB_018ac87c;
    }
LAB_018ac874:
    local_bd = 1;
  }
  bVar10 = 0;
LAB_018ac87c:
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            (&local_b0,(MultisamplePixelBufferAccess *)(local_78 + 0x10));
  iVar5 = 0;
  if (0 < iVar11) {
    iVar5 = iVar11;
  }
  iVar8 = 0;
  if (0 < local_bc) {
    iVar8 = local_bc;
  }
  iVar1 = iVar7 + iVar11;
  if (local_b0.m_access.m_size.m_data[1] <= iVar7 + iVar11) {
    iVar1 = local_b0.m_access.m_size.m_data[1];
  }
  iVar11 = iVar12 + local_bc;
  if (local_b0.m_access.m_size.m_data[2] <= iVar12 + local_bc) {
    iVar11 = local_b0.m_access.m_size.m_data[2];
  }
  if (((0 < iVar1 - iVar5) && (0 < iVar11 - iVar8)) && (bVar10 == 0)) {
    rr::getSubregion((MultisamplePixelBufferAccess *)&local_b0,
                     (MultisamplePixelBufferAccess *)(local_78 + 0x10),iVar5,iVar8,iVar1 - iVar5,
                     iVar11 - iVar8);
    local_78._0_4_ = value[0];
    local_78._4_4_ = value[1];
    local_78._8_8_ = *(undefined8 *)(value + 2);
    if ((this->m_sRGBUpdateEnabled == true) &&
       (bVar2 = tcu::isSRGB(local_b0.m_access.m_format), bVar2)) {
      tcu::linearToSRGB((tcu *)&local_88,(Vec4 *)local_78);
      local_78._0_4_ = local_88.order;
      local_78._4_4_ = local_88.type;
      local_78._8_4_ = aiStack_80[0];
      local_78._12_4_ = aiStack_80[1];
    }
    if (local_bd == 0) {
      rr::clear((MultisamplePixelBufferAccess *)&local_b0,(Vec4 *)local_78);
    }
    else if (0 < local_b0.m_access.m_size.m_data[2]) {
      iVar12 = 0;
      iVar11 = local_b0.m_access.m_size.m_data[2];
      iVar7 = local_b0.m_access.m_size.m_data[1];
      do {
        if (0 < iVar7) {
          iVar8 = 0;
          iVar5 = local_b0.m_access.m_size.m_data[0];
          do {
            if (0 < iVar5) {
              iVar11 = 0;
              do {
                tcu::ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)(local_78 + 0x38),(int)&local_b0,iVar11,iVar8);
                local_88.order = R;
                local_88.type = SNORM_INT8;
                aiStack_80[0] = 0;
                aiStack_80[1] = 0;
                pCVar3 = (ConstPixelBufferAccess *)local_78;
                lVar6 = 0;
                pCVar4 = (ConstPixelBufferAccess *)(local_78 + 0x38);
                do {
                  pCVar9 = pCVar3;
                  if ((this->m_colorMask).m_data[lVar6] == false) {
                    pCVar9 = pCVar4;
                  }
                  (&local_88.order)[lVar6] = (pCVar9->m_format).order;
                  lVar6 = lVar6 + 1;
                  pCVar4 = (ConstPixelBufferAccess *)&(pCVar4->m_format).type;
                  pCVar3 = (ConstPixelBufferAccess *)&(pCVar3->m_format).type;
                } while (lVar6 != 4);
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)&local_b0,(Vec4 *)&local_88,iVar11,iVar8,iVar12);
                iVar11 = iVar11 + 1;
                iVar7 = local_b0.m_access.m_size.m_data[1];
                iVar5 = local_b0.m_access.m_size.m_data[0];
              } while (iVar11 < local_b0.m_access.m_size.m_data[0]);
            }
            iVar8 = iVar8 + 1;
            iVar11 = local_b0.m_access.m_size.m_data[2];
          } while (iVar8 < iVar7);
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 < iVar11);
    }
  }
  return;
}

Assistant:

void ReferenceContext::clearBufferfv (deUint32 buffer, int drawbuffer, const float* value)
{
	RC_IF_ERROR(buffer != GL_COLOR && buffer != GL_DEPTH, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(drawbuffer != 0, GL_INVALID_VALUE, RC_RET_VOID); // \todo [2012-04-06 pyry] MRT support.

	IVec4 baseArea = m_scissorEnabled ? m_scissorBox : IVec4(0, 0, 0x7fffffff, 0x7fffffff);

	if (buffer == GL_COLOR)
	{
		rr::MultisamplePixelBufferAccess	colorBuf	= getDrawColorbuffer();
		bool								maskUsed	= !m_colorMask[0] || !m_colorMask[1] || !m_colorMask[2] || !m_colorMask[3];
		bool								maskZero	= !m_colorMask[0] && !m_colorMask[1] && !m_colorMask[2] && !m_colorMask[3];
		IVec4								area		= intersect(baseArea, getBufferRect(colorBuf));

		if (!isEmpty(area) && !maskZero)
		{
			rr::MultisamplePixelBufferAccess	access		= rr::getSubregion(colorBuf, area.x(), area.y(), area.z(), area.w());
			Vec4								color		(value[0], value[1], value[2], value[3]);

			if (m_sRGBUpdateEnabled && tcu::isSRGB(access.raw().getFormat()))
				color = tcu::linearToSRGB(color);

			if (!maskUsed)
				rr::clear(access, color);
			else
			{
				for (int y = 0; y < access.raw().getDepth(); y++)
					for (int x = 0; x < access.raw().getHeight(); x++)
						for (int s = 0; s < access.getNumSamples(); s++)
							access.raw().setPixel(tcu::select(color, access.raw().getPixel(s, x, y), m_colorMask), s, x, y);
			}
		}
	}
	else
	{
		TCU_CHECK_INTERNAL(buffer == GL_DEPTH);

		rr::MultisamplePixelBufferAccess	depthBuf	= getDrawDepthbuffer();
		IVec4								area		= intersect(baseArea, getBufferRect(depthBuf));

		if (!isEmpty(area) && m_depthMask)
		{
			rr::MultisamplePixelBufferAccess	access		= rr::getSubregion(depthBuf, area.x(), area.y(), area.z(), area.w());
			float								depth		= value[0];

			rr::clearDepth(access, depth);
		}
	}
}